

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int WriteToFile(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  _Setfill<char> _Var4;
  _Setprecision _Var5;
  _Setw _Var6;
  ostream *poVar7;
  void *pvVar8;
  int in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  double in_stack_00000058;
  double in_stack_00000060;
  double in_stack_00000068;
  double in_stack_00000070;
  double in_stack_00000978;
  double in_stack_00000980;
  double in_stack_00000988;
  int in_stack_00000990;
  int in_stack_00000994;
  double in_stack_000012a8;
  double in_stack_000012b0;
  double in_stack_000012b8;
  int local_538;
  int prn_3;
  int local_510;
  int prn_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500 [35];
  char local_4dd;
  int local_4dc;
  int local_4d8;
  char local_4d1;
  int prn_1;
  int local_4cc;
  int local_4c8;
  int prn;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [32];
  long local_478;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [7];
  bool isdata;
  allocator local_239;
  string local_238 [8];
  string fix;
  long local_218;
  ifstream in;
  string *path_local;
  
  std::ifstream::ifstream(&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"result.txt",&local_239);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::operator+(local_270,param_1);
  std::ifstream::open((string *)&local_218,(_Ios_Openmode)local_270);
  std::__cxx11::string::~string((string *)local_270);
  bVar2 = false;
  bVar3 = std::ios::eof();
  if (((bVar3 & 1) != 0) ||
     (bVar3 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18))),
     (bVar3 & 1) != 0)) {
    bVar2 = true;
  }
  std::ifstream::close();
  std::ofstream::ofstream(&local_478);
  std::operator+(local_498,param_1);
  std::ofstream::open((string *)&local_478,(_Ios_Openmode)local_498);
  std::__cxx11::string::~string((string *)local_498);
  bVar3 = std::ios::operator!((ios *)((long)&local_478 + *(long *)(local_478 + -0x18)));
  if ((bVar3 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"error happened when writing file");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::ofstream::~ofstream(&local_478);
    std::__cxx11::string::~string(local_238);
    std::ifstream::~ifstream(&local_218);
    return 1;
  }
  if (bVar2) {
    std::operator<<((ostream *)&local_478,
                    "Week      SOW         ECEF/X-m      ECEF/Y-m      ECEF/Z-m     ");
    std::operator<<((ostream *)&local_478,"REF-ECEF/X-m  REF-ECEF/Y-m    ECEF/Z-m      ");
    poVar7 = std::operator<<((ostream *)&local_478,
                             "EAST/m  NORTH/m  UP/m    B/deg     L/deg     H/m      VX-m/s  VY-m/s  VZ-m/s     PDOP  Sigma-m  Sigma-m/s    BDSObsNum     GPSObsNum"
                            );
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  poVar7 = (ostream *)std::ostream::operator<<(&local_478,std::fixed);
  local_49c = (int)std::setprecision(4);
  std::operator<<(poVar7,(_Setprecision)local_49c);
  poVar7 = (ostream *)std::ostream::operator<<(&local_478,in_stack_00000008);
  poVar7 = std::operator<<(poVar7,"  ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000010);
  std::operator<<(poVar7,"  ");
  poVar7 = (ostream *)std::ostream::operator<<(&local_478,in_stack_00000018);
  poVar7 = std::operator<<(poVar7,"  ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000020);
  poVar7 = std::operator<<(poVar7,"  ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000028);
  std::operator<<(poVar7,"  ");
  if ((in_stack_00000048 != -1.0) || (NAN(in_stack_00000048))) {
    poVar7 = (ostream *)std::ostream::operator<<(&local_478,in_stack_00000048);
    poVar7 = std::operator<<(poVar7,"  ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000050);
    poVar7 = std::operator<<(poVar7,"  ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000058);
    std::operator<<(poVar7,"  ");
  }
  local_4a0 = (int)std::setw(8);
  poVar7 = std::operator<<((ostream *)&local_478,(_Setw)local_4a0);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000978);
  local_4a4 = (int)std::setw(8);
  poVar7 = std::operator<<(poVar7,(_Setw)local_4a4);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000980);
  local_4a8 = (int)std::setw(8);
  poVar7 = std::operator<<(poVar7,(_Setw)local_4a8);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000988);
  std::operator<<(poVar7,"  ");
  poVar7 = (ostream *)std::ostream::operator<<(&local_478,in_stack_00000030);
  poVar7 = std::operator<<(poVar7,"  ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000038);
  poVar7 = std::operator<<(poVar7,"  ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000040);
  std::operator<<(poVar7,"  ");
  local_4ac = (int)std::setw(8);
  poVar7 = std::operator<<((ostream *)&local_478,(_Setw)local_4ac);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000060);
  local_4b0 = (int)std::setw(8);
  poVar7 = std::operator<<(poVar7,(_Setw)local_4b0);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000068);
  local_4b4 = (int)std::setw(8);
  poVar7 = std::operator<<(poVar7,(_Setw)local_4b4);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000070);
  std::operator<<(poVar7,"  ");
  local_4b8 = (int)std::setw(8);
  poVar7 = std::operator<<((ostream *)&local_478,(_Setw)local_4b8);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_000012b8);
  local_4bc = (int)std::setw(8);
  poVar7 = std::operator<<(poVar7,(_Setw)local_4bc);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_000012a8);
  local_4c0 = (int)std::setw(8);
  poVar7 = std::operator<<(poVar7,(_Setw)local_4c0);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_000012b0);
  std::operator<<(poVar7,"  ");
  prn = (int)std::setw(10);
  poVar7 = std::operator<<((ostream *)&local_478,(_Setw)prn);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000994);
  poVar7 = std::operator<<(poVar7,"  ");
  local_4c8 = (int)std::setw(10);
  poVar7 = std::operator<<(poVar7,(_Setw)local_4c8);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000990);
  std::operator<<(poVar7,"       ");
  for (local_4cc = 0; local_4cc < 0x40; local_4cc = local_4cc + 1) {
    if (((*(double *)(&stack0x00000aa8 + (long)local_4cc * 8) != 0.0) ||
        (NAN(*(double *)(&stack0x00000aa8 + (long)local_4cc * 8)))) &&
       ((*(double *)(&stack0x00000088 + (long)local_4cc * 0x18) != -1.0 ||
        (NAN(*(double *)(&stack0x00000088 + (long)local_4cc * 0x18)))))) {
      poVar7 = std::operator<<((ostream *)&local_478,"C");
      prn_1 = (int)std::setw(2);
      poVar7 = std::operator<<(poVar7,(_Setw)prn_1);
      local_4d1 = (char)std::setfill<char>('0');
      poVar7 = std::operator<<(poVar7,local_4d1);
      std::ostream::operator<<(poVar7,local_4cc + 1);
    }
  }
  for (local_4d8 = 0; local_4d8 < 0x20; local_4d8 = local_4d8 + 1) {
    if (((*(double *)(&stack0x000009a8 + (long)local_4d8 * 8) != 0.0) ||
        (NAN(*(double *)(&stack0x000009a8 + (long)local_4d8 * 8)))) &&
       ((*(double *)(&stack0x00000688 + (long)local_4d8 * 0x18) != -1.0 ||
        (NAN(*(double *)(&stack0x00000688 + (long)local_4d8 * 0x18)))))) {
      poVar7 = std::operator<<((ostream *)&local_478,"G");
      local_4dc = (int)std::setw(2);
      poVar7 = std::operator<<(poVar7,(_Setw)local_4dc);
      local_4dd = (char)std::setfill<char>('0');
      poVar7 = std::operator<<(poVar7,local_4dd);
      std::ostream::operator<<(poVar7,local_4d8 + 1);
    }
  }
  std::ostream::operator<<(&local_478,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::__cxx11::string::operator=(local_238,"sat.txt");
  std::operator+(local_500,param_1);
  std::ofstream::open((string *)&local_478,(_Ios_Openmode)local_500);
  std::__cxx11::string::~string((string *)local_500);
  poVar7 = (ostream *)std::ostream::operator<<(&local_478,std::fixed);
  _Var5 = std::setprecision(4);
  std::operator<<(poVar7,_Var5);
  poVar7 = (ostream *)std::ostream::operator<<(&local_478,in_stack_00000008);
  poVar7 = std::operator<<(poVar7,"  ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000010);
  std::operator<<(poVar7,"  ");
  _Var6 = std::setw(3);
  poVar7 = std::operator<<((ostream *)&local_478,_Var6);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000994);
  poVar7 = std::operator<<(poVar7,"  ");
  _Var6 = std::setw(3);
  poVar7 = std::operator<<(poVar7,_Var6);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,in_stack_00000990);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  for (local_510 = 0; local_510 < 0x40; local_510 = local_510 + 1) {
    if (((*(double *)(&stack0x00000aa8 + (long)local_510 * 8) != 0.0) ||
        (NAN(*(double *)(&stack0x00000aa8 + (long)local_510 * 8)))) &&
       ((*(double *)(&stack0x00000088 + (long)local_510 * 0x18) != -1.0 ||
        (NAN(*(double *)(&stack0x00000088 + (long)local_510 * 0x18)))))) {
      poVar7 = std::operator<<((ostream *)&local_478,"C");
      _Var6 = std::setw(2);
      poVar7 = std::operator<<(poVar7,_Var6);
      _Var4 = std::setfill<char>('0');
      poVar7 = std::operator<<(poVar7,_Var4._M_c);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_510 + 1);
      std::operator<<(poVar7," ");
      _Var4 = std::setfill<char>(' ');
      std::operator<<(&local_478,_Var4._M_c);
      poVar7 = (ostream *)std::ostream::operator<<(&local_478,std::fixed);
      _Var5 = std::setprecision(4);
      std::operator<<(poVar7,_Var5);
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<((ostream *)&local_478,_Var6);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(double *)(&stack0x00000078 + (long)local_510 * 0x18));
      poVar7 = std::operator<<(poVar7,"  ");
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<(poVar7,_Var6);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(double *)(&stack0x00000080 + (long)local_510 * 0x18));
      poVar7 = std::operator<<(poVar7,"  ");
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<(poVar7,_Var6);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(double *)(&stack0x00000088 + (long)local_510 * 0x18));
      std::operator<<(poVar7,"  ");
      poVar7 = (ostream *)std::ostream::operator<<(&local_478,std::fixed);
      _Var5 = std::setprecision(10);
      std::operator<<(poVar7,_Var5);
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<((ostream *)&local_478,_Var6);
      poVar7 = (ostream *)
               std::ostream::operator<<(poVar7,*(double *)(&stack0x000010a8 + (long)local_510 * 8));
      poVar7 = std::operator<<(poVar7,"  ");
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<(poVar7,_Var6);
      pvVar8 = (void *)std::ostream::operator<<
                                 (poVar7,*(double *)(&stack0x00000da8 + (long)local_510 * 8));
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  for (local_538 = 0; local_538 < 0x20; local_538 = local_538 + 1) {
    if (((*(double *)(&stack0x000009a8 + (long)local_538 * 8) != 0.0) ||
        (NAN(*(double *)(&stack0x000009a8 + (long)local_538 * 8)))) &&
       ((*(double *)(&stack0x00000688 + (long)local_538 * 0x18) != -1.0 ||
        (NAN(*(double *)(&stack0x00000688 + (long)local_538 * 0x18)))))) {
      poVar7 = std::operator<<((ostream *)&local_478,"G");
      _Var6 = std::setw(2);
      poVar7 = std::operator<<(poVar7,_Var6);
      _Var4 = std::setfill<char>('0');
      poVar7 = std::operator<<(poVar7,_Var4._M_c);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_538 + 1);
      std::operator<<(poVar7," ");
      _Var4 = std::setfill<char>(' ');
      std::operator<<(&local_478,_Var4._M_c);
      poVar7 = (ostream *)std::ostream::operator<<(&local_478,std::fixed);
      _Var5 = std::setprecision(4);
      std::operator<<(poVar7,_Var5);
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<((ostream *)&local_478,_Var6);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(double *)(&stack0x00000678 + (long)local_538 * 0x18));
      poVar7 = std::operator<<(poVar7,"  ");
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<(poVar7,_Var6);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(double *)(&stack0x00000680 + (long)local_538 * 0x18));
      poVar7 = std::operator<<(poVar7,"  ");
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<(poVar7,_Var6);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(double *)(&stack0x00000688 + (long)local_538 * 0x18));
      std::operator<<(poVar7,"  ");
      poVar7 = (ostream *)std::ostream::operator<<(&local_478,std::fixed);
      _Var5 = std::setprecision(10);
      std::operator<<(poVar7,_Var5);
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<((ostream *)&local_478,_Var6);
      poVar7 = (ostream *)
               std::ostream::operator<<(poVar7,*(double *)(&stack0x00000fa8 + (long)local_538 * 8));
      poVar7 = std::operator<<(poVar7,"  ");
      _Var6 = std::setw(0xf);
      poVar7 = std::operator<<(poVar7,_Var6);
      pvVar8 = (void *)std::ostream::operator<<
                                 (poVar7,*(double *)(&stack0x00000ca8 + (long)local_538 * 8));
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int WriteToFile(SPPResult result, string path){
    ifstream in;
    string fix = "result.txt";
    in.open(path + fix);
    bool isdata = false;
    if(in.eof() || !in)
        isdata = true;
    in.close();

    ofstream out;
    out.open(path + fix, ios::app);
    if(!out){
        cout << "error happened when writing file" << endl;
        return 1;
    }
    out.right;
    if(isdata) {
        out << "Week      SOW         ECEF/X-m      ECEF/Y-m      ECEF/Z-m     ";
        out << "REF-ECEF/X-m  REF-ECEF/Y-m    ECEF/Z-m      ";
        out << "EAST/m  NORTH/m  UP/m    B/deg     L/deg     H/m      VX-m/s  VY-m/s  VZ-m/s     PDOP  Sigma-m  Sigma-m/s    BDSObsNum     GPSObsNum" << endl;
    }

    out << fixed << setprecision(4);
    out << result.ObsTime.Week << "  " << result.ObsTime.SOW << "  ";
    out << result.UserPositionXYZ.X << "  " << result.UserPositionXYZ.Y << "  " << result.UserPositionXYZ.Z << "  ";
    if(result.UserRefPositionXYZ.X != -1)
        out << result.UserRefPositionXYZ.X << "  " << result.UserRefPositionXYZ.Y << "  " << result.UserRefPositionXYZ.Z << "  ";
    out << setw(8) << result.diffNeu.X << setw(8) << result.diffNeu.Y << setw(8) << result.diffNeu.Z << "  ";
    out << result.UserPositionBLH.B << "  " << result.UserPositionBLH.L << "  " << result.UserPositionBLH.H << "  ";
    out << setw(8) << result.UserVelocity.X << setw(8) << result.UserVelocity.Y << setw(8) << result.UserVelocity.Z << "  ";
    out << setw(8) << result.PDop << setw(8) << result.UserPositionSigma << setw(8) << result.UserVelocitySigma << "  ";
    out << setw(10) << result.BDSObsNum << "  " << setw(10) << result.GPSObsNum << "       ";
    for(int prn = 0; prn < MAXBDSSRN; ++ prn) {
        if(result.BDSDist[prn] != 0 && result.BDSPosi[prn].Z != -1)
            out << "C" << setw(2) << setfill('0') << prn + 1;
    }
    for(int prn = 0; prn < MAXGPSSRN; ++ prn) {
        if(result.GPSDist[prn] != 0 && result.GPSPosi[prn].Z != -1)
            out << "G" << setw(2) << setfill('0') << prn + 1;
    }
    out << endl;
    out.close();

    fix = "sat.txt";
    out.open(path + fix, ios::app);
    out.right;
    out << fixed << setprecision(4);
    out << result.ObsTime.Week << "  " << result.ObsTime.SOW << "  ";
    out << setw(3) << result.BDSObsNum << "  " << setw(3) << result.GPSObsNum << endl;
    for(int prn = 0; prn < MAXBDSSRN; ++ prn) {
        if(result.BDSDist[prn] != 0 && result.BDSPosi[prn].Z != -1) {
            out << "C" << setw(2) << setfill('0') << prn + 1 << " ";
            out << setfill(' ');
            out << fixed << setprecision(4);
            out << setw(15) << result.BDSPosi[prn].X << "  " << setw(15) << result.BDSPosi[prn].Y << "  " << setw(15) << result.BDSPosi[prn].Z << "  ";
            out << fixed << setprecision(10);
            out << setw(15) << result.BDSAzimuth[prn] << "  " << setw(15) << result.BDSelev[prn] << endl;
        }
    }
    for(int prn = 0; prn < MAXGPSSRN; ++ prn) {
        if(result.GPSDist[prn] != 0 && result.GPSPosi[prn].Z != -1) {
            out << "G" << setw(2) << setfill('0') << prn + 1 << " ";
            out << setfill(' ');
            out << fixed << setprecision(4);
            out << setw(15) << result.GPSPosi[prn].X << "  " << setw(15) << result.GPSPosi[prn].Y << "  " << setw(15) << result.GPSPosi[prn].Z << "  ";
            out << fixed << setprecision(10);
            out << setw(15) << result.GPSAzimuth[prn] << "  " << setw(15) << result.GPSelev[prn] << endl;
        }
    }
}